

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O3

void P_SpawnSlopeMakers(FMapThing *firstmt,FMapThing *lastmt,int *oldvertextable)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  vertex_t vVar4;
  ushort uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  FDoomEdEntry *pFVar9;
  sector_t_conflict *psVar10;
  line_t_conflict *plVar11;
  line_t_conflict *plVar12;
  vertex_t *pvVar13;
  vertex_t *pvVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  bool bVar19;
  uint uVar20;
  int iVar21;
  subsector_t *psVar22;
  Node *pNVar23;
  double *pdVar24;
  secplane_t *psVar25;
  TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *pTVar26;
  Node *pNVar27;
  double *pdVar28;
  double *pdVar29;
  long lVar30;
  double *pdVar31;
  vertex_t *pvVar32;
  bool bVar33;
  uint uVar34;
  Node *pNVar35;
  Node *pNVar36;
  byte bVar37;
  uint uVar38;
  FMapThing *pFVar39;
  long lVar40;
  uint uVar41;
  double dVar42;
  double dVar43;
  double dVar46;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  double in_XMM1_Qb;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  undefined1 auVar52 [16];
  double dVar54;
  undefined1 auVar53 [16];
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  undefined1 auVar59 [16];
  double dVar60;
  double dVar61;
  double dVar62;
  undefined1 local_e8 [8];
  double dStack_e0;
  FLineIdIterator local_d0;
  double local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [20];
  undefined4 uStack_a4;
  TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> local_a0;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  long local_58;
  double *local_50;
  double local_48;
  double dStack_40;
  
  pFVar39 = firstmt;
  if (firstmt < lastmt) {
    do {
      pFVar9 = pFVar39->info;
      if (((pFVar9 != (FDoomEdEntry *)0x0) && (pFVar9->Type == (PClassActor *)0x0)) &&
         (uVar6 = pFVar9->Special, (ushort)(uVar6 - 0xf) < 6)) {
        auVar49._0_8_ = (pFVar39->pos).X;
        auVar49._8_8_ = (pFVar39->pos).Y;
        auVar15._4_8_ = in_XMM1_Qb;
        auVar15._0_4_ = (int)((ulong)auVar49._0_8_ >> 0x20);
        auVar48._0_8_ = auVar15._0_8_ << 0x20;
        auVar48._8_4_ = (int)auVar49._8_8_;
        auVar48._12_4_ = (int)((ulong)auVar49._8_8_ >> 0x20);
        local_88 = auVar48._8_8_;
        local_b8._0_16_ = auVar49;
        dStack_80 = (double)auVar49._8_8_;
        psVar22 = P_PointInSubsector((double)auVar49._0_8_,local_88);
        uVar5 = pFVar39->info->Special;
        if ((uVar5 < 0x15) && ((0x150000U >> (uVar5 & 0x1f) & 1) != 0)) {
          local_e8._0_4_ = 1;
          lVar30 = 0xd8;
        }
        else {
          lVar30 = 0xb0;
          auVar59._12_4_ = 0;
          auVar59._0_12_ = stack0xffffffffffffff1c;
          _local_e8 = auVar59 << 0x20;
        }
        psVar10 = psVar22->sector;
        local_c8 = ((pFVar39->pos).Y * *(double *)((long)&psVar10->planes[0].xform.yOffs + lVar30) +
                   (pFVar39->pos).X * *(double *)((long)&psVar10->planes[0].xform.xOffs + lVar30) +
                   *(double *)((long)&psVar10->planes[0].xform.xScale + lVar30)) *
                   *(double *)((long)&psVar10->planes[0].xform.yScale + lVar30) + (pFVar39->pos).Z;
        in_XMM1_Qb = 0.0;
        uStack_c0 = 0;
        unique0x1000124c = local_c8;
        if ((short)uVar5 < 0x11) {
          local_d0.searchtag = pFVar39->args[0];
          local_d0.start = tagManager.IDHashFirst[local_d0.searchtag & 0xff];
          uVar20 = FLineIdIterator::Next(&local_d0);
          if (-1 < (int)uVar20) {
            lVar30 = 0xb0;
            if (local_e8[0] != false) {
              lVar30 = 0xd8;
            }
            do {
              dVar42 = lines[uVar20].delta.X;
              dVar51 = ((lines[uVar20].v1)->p).X;
              dVar55 = ((lines[uVar20].v1)->p).Y;
              dVar46 = (double)auVar49._8_8_ - dVar55;
              dVar62 = dVar46 * dVar42;
              dVar43 = lines[uVar20].delta.Y;
              dVar54 = lines[uVar20].bbox
                       [(ulong)(1.52587890625e-05 <
                               (dVar51 - (double)auVar49._0_8_) * dVar43 + dVar62) + 4];
              if (dVar54 != 0.0) {
                dVar2 = *(double *)((long)dVar54 + 0x18 + lVar30);
                dVar60 = SUB168(*(undefined1 (*) [16])((long)dVar54 + lVar30),0);
                dVar61 = SUB168(*(undefined1 (*) [16])((long)dVar54 + lVar30),8);
                dVar3 = *(double *)((long)dVar54 + 0x20 + lVar30);
                dVar55 = (dVar55 * dVar61 + dVar2 + dVar51 * dVar60) * dVar3;
                dVar58 = local_c8 - dVar55;
                dVar55 = (((lines[uVar20].v2)->p).Y * dVar61 +
                         dVar2 + ((lines[uVar20].v2)->p).X * dVar60) * dVar3 - dVar55;
                local_78 = dVar43 * dVar58 - dVar46 * dVar55;
                dStack_70 = ((double)auVar49._0_8_ - dVar51) * dVar55 - dVar42 * dVar58;
                local_68 = dVar62 - dVar43 * ((double)auVar49._0_8_ - dVar51);
                dStack_60 = dVar46;
                dVar42 = c_sqrt(local_68 * local_68 + dStack_70 * dStack_70 + local_78 * local_78);
                if ((dVar42 == 0.0) && (!NAN(dVar42))) {
                  in_XMM1_Qb = dStack_80;
                  Printf("Slope thing at (%f,%f) lies directly on its target line.\n",auVar49._0_8_,
                         local_88);
                  break;
                }
                dVar42 = 1.0 / dVar42;
                dVar51 = local_68 * dVar42;
                dVar43 = -dVar51;
                bVar33 = dVar51 < dVar43;
                if (local_e8[0] != false) {
                  bVar33 = dVar43 < dVar51;
                }
                uVar20 = (uint)bVar33;
                if (!bVar33) {
                  dVar43 = dVar51;
                }
                auVar47._0_8_ = dVar42 * local_78;
                auVar47._8_8_ = dVar42 * dStack_70;
                auVar56._0_4_ = (int)(uVar20 << 0x1f) >> 0x1f;
                auVar56._4_4_ = (int)((uint)bVar33 << 0x1f) >> 0x1f;
                auVar56._8_4_ = (int)(uVar20 << 0x1f) >> 0x1f;
                auVar56._12_4_ = (int)(uVar20 << 0x1f) >> 0x1f;
                auVar48 = (auVar47 ^ _DAT_005d6f40) & auVar56 | ~auVar56 & auVar47;
                uVar18 = (ulong)DAT_005d6f40;
                *(undefined1 (*) [16])((long)dVar54 + lVar30) = auVar48;
                *(double *)((long)dVar54 + 0x10 + lVar30) = dVar43;
                *(double *)((long)dVar54 + 0x18 + lVar30) =
                     ((double)(auVar48._0_8_ ^ uVar18) * (double)auVar49._0_8_ -
                     (double)auVar49._8_8_ * auVar48._8_8_) - local_c8 * dVar43;
                *(double *)((long)dVar54 + 0x20 + lVar30) = -1.0 / dVar43;
              }
              in_XMM1_Qb = 0.0;
              uVar20 = FLineIdIterator::Next(&local_d0);
            } while (-1 < (int)uVar20);
          }
        }
        else if (uVar5 < 0x13) {
          P_SetSlope((secplane_t *)((long)&psVar10->planes[0].xform.xOffs + lVar30),local_e8[0],
                     (int)pFVar39->angle,pFVar39->args[0],(DVector3 *)local_b8);
        }
        else {
          P_VavoomSlope(psVar10,pFVar39->thingid,&pFVar39->pos,(uint)local_e8[0]);
        }
        pFVar39->EdNum = 0;
      }
      pFVar39 = pFVar39 + 1;
    } while (pFVar39 < lastmt);
    pFVar39 = firstmt;
    if (firstmt < lastmt) {
      do {
        pFVar9 = pFVar39->info;
        if (((pFVar9 != (FDoomEdEntry *)0x0) && (pFVar9->Type == (PClassActor *)0x0)) &&
           (uVar7 = pFVar9->Special, (ushort)(uVar7 - 0x15) < 2)) {
          iVar21 = pFVar39->args[0];
          psVar22 = P_PointInSubsector((pFVar39->pos).X,(pFVar39->pos).Y);
          P_CopyPlane(iVar21,psVar22->sector,uVar7 == 0x16);
          pFVar39->EdNum = 0;
        }
        pFVar39 = pFVar39 + 1;
      } while (pFVar39 < lastmt);
    }
  }
  lVar30 = 0;
  do {
    *(undefined4 *)((long)&uStack_a4 + lVar30) = 0;
    TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::SetNodeVector
              ((TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *)(local_b8 + lVar30),1);
    lVar30 = lVar30 + 0x18;
  } while (lVar30 != 0x30);
  bVar37 = 0;
  if (firstmt < lastmt) {
    do {
      pFVar9 = firstmt->info;
      if (((pFVar9 != (FDoomEdEntry *)0x0) && (pFVar9->Type == (PClassActor *)0x0)) &&
         (uVar8 = pFVar9->Special, (ushort)(uVar8 - 0x17) < 2)) {
        if (0 < numvertexes) {
          lVar30 = 8;
          lVar40 = 0;
          iVar21 = numvertexes;
          do {
            dVar42 = *(double *)((long)vertexes + lVar30 + -8);
            if ((dVar42 == (firstmt->pos).X) && (!NAN(dVar42) && !NAN((firstmt->pos).X))) {
              dVar42 = *(double *)((long)&(vertexes->p).X + lVar30);
              pdVar29 = &(firstmt->pos).Y;
              if ((dVar42 == *pdVar29) && (!NAN(dVar42) && !NAN(*pdVar29))) {
                dVar42 = (firstmt->pos).Z;
                pTVar26 = &local_a0;
                if (firstmt->info->Special == 0x17) {
                  pTVar26 = (TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *)local_b8;
                }
                pNVar23 = TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::GetNode
                                    (pTVar26,(int)lVar40);
                (pNVar23->Pair).Value = dVar42;
                bVar37 = 1;
                iVar21 = numvertexes;
              }
            }
            lVar40 = lVar40 + 1;
            lVar30 = lVar30 + 0x10;
          } while (lVar40 < iVar21);
        }
        firstmt->EdNum = 0;
      }
      firstmt = firstmt + 1;
    } while (firstmt < lastmt);
  }
  if (0 < numvertexdatas) {
    lVar30 = 0;
    lVar40 = 0;
    do {
      if (oldvertextable == (int *)0x0) {
        iVar21 = (int)lVar40;
      }
      else {
        iVar21 = oldvertextable[lVar40];
      }
      uVar20 = *(uint *)((long)&vertexdatas->flags + lVar30);
      if ((uVar20 & 1) != 0) {
        dVar42 = *(double *)((long)&vertexdatas->zCeiling + lVar30);
        pNVar23 = TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::GetNode
                            (&local_a0,iVar21);
        (pNVar23->Pair).Value = dVar42;
        uVar20 = *(uint *)((long)&vertexdatas->flags + lVar30);
        bVar37 = 1;
      }
      if ((uVar20 & 2) != 0) {
        dVar42 = *(double *)((long)&vertexdatas->zFloor + lVar30);
        pNVar23 = TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::GetNode
                            ((TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *)local_b8,
                             iVar21);
        (pNVar23->Pair).Value = dVar42;
        bVar37 = 1;
      }
      lVar40 = lVar40 + 1;
      lVar30 = lVar30 + 0x18;
    } while (lVar40 < numvertexdatas);
  }
  if (vertexdatas != (vertexdata_t *)0x0) {
    operator_delete__(vertexdatas);
  }
  vertexdatas = (vertexdata_t *)0x0;
  numvertexdatas = 0;
  if ((bool)(bVar37 & 0 < numsectors)) {
    lVar30 = 0;
    iVar21 = numsectors;
    do {
      psVar10 = sectors;
      lVar40 = lVar30;
      if (sectors[lVar30].linecount == 3) {
        plVar11 = *sectors[lVar30].lines;
        plVar12 = sectors[lVar30].lines[1];
        pvVar13 = plVar11->v1;
        pvVar14 = plVar11->v2;
        pvVar32 = plVar12->v1;
        if (pvVar32 == pvVar14 || pvVar32 == pvVar13) {
          pvVar32 = plVar12->v2;
        }
        uVar41 = (uint)((ulong)((long)pvVar13 - (long)vertexes) >> 4);
        uVar38 = (uint)((ulong)((long)pvVar14 - (long)vertexes) >> 4);
        uVar20 = (uint)((ulong)((long)pvVar32 - (long)vertexes) >> 4);
        vVar4.p = vertexes[(int)uVar20].p;
        auVar44._0_8_ = vVar4.p.Y;
        auVar44._8_4_ = vVar4.p.X._0_4_;
        auVar44._12_4_ = vVar4.p.X._4_4_;
        local_88 = vertexes[(int)uVar38].p.Y;
        dStack_80 = vertexes[(int)uVar41].p.X;
        pdVar1 = &sectors[lVar30].planes[1].TexZ;
        local_48 = vertexes[(int)uVar41].p.Y;
        dStack_40 = vertexes[(int)uVar38].p.X;
        pdVar29 = &sectors[lVar30].planes[0].TexZ;
        bVar37 = 0;
        pTVar26 = (TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *)local_b8;
        local_58 = lVar30;
        local_50 = pdVar29;
        bVar33 = true;
        do {
          bVar19 = bVar33;
          pNVar23 = pTVar26->Nodes;
          uVar34 = pTVar26->Size - 1;
          pNVar35 = pNVar23 + (uVar34 & uVar41);
          do {
            pNVar27 = pNVar35;
            if ((pNVar27 == (Node *)0x0) || (pNVar27->Next == (Node *)0x1)) {
              pNVar27 = (Node *)0x0;
              break;
            }
            pNVar35 = pNVar27->Next;
          } while ((pNVar27->Pair).Key != uVar41);
          pNVar35 = pNVar23 + (uVar34 & uVar38);
          do {
            pNVar36 = pNVar35;
            if ((pNVar36 == (Node *)0x0) || (pNVar36->Next == (Node *)0x1)) {
              pNVar36 = (Node *)0x0;
              break;
            }
            pNVar35 = pNVar36->Next;
          } while ((pNVar36->Pair).Key != uVar38);
          pdVar31 = &(pNVar36->Pair).Value;
          pNVar23 = pNVar23 + (uVar34 & uVar20);
          do {
            pNVar35 = pNVar23;
            if ((pNVar35 == (Node *)0x0) || (pNVar35->Next == (Node *)0x1)) {
              if (pNVar27 == (Node *)0x0 && pNVar36 == (Node *)0x0) goto LAB_00451ce9;
              bVar33 = true;
              pdVar24 = (double *)0x0;
              goto LAB_00451a4a;
            }
            pNVar23 = pNVar35->Next;
          } while ((pNVar35->Pair).Key != uVar20);
          pdVar24 = &(pNVar35->Pair).Value;
          bVar33 = false;
LAB_00451a4a:
          if (pNVar27 == (Node *)0x0) {
            if (bVar19) {
              dVar42 = *pdVar29;
              if (pNVar36 == (Node *)0x0) {
                auVar45._8_8_ = dVar42;
                auVar45._0_8_ = dVar42;
                goto LAB_00451aa1;
              }
            }
            else {
              dVar42 = *pdVar1;
              if (pNVar36 == (Node *)0x0) {
                pdVar31 = pdVar1;
              }
            }
LAB_00451a92:
            pdVar28 = pdVar1;
            if (bVar19) {
              pdVar28 = pdVar29;
            }
            auVar45._8_8_ = *pdVar31;
            auVar45._0_8_ = dVar42;
            pdVar29 = pdVar28;
          }
          else {
            dVar42 = (pNVar27->Pair).Value;
            if (pNVar36 == (Node *)0x0) {
              pdVar31 = pdVar1;
            }
            if (!(bool)(pNVar36 == (Node *)0x0 & bVar19)) goto LAB_00451a92;
            auVar45._8_8_ = *pdVar29;
            auVar45._0_8_ = dVar42;
          }
LAB_00451aa1:
          if (bVar33) {
            pdVar24 = pdVar29;
          }
          plVar11 = *psVar10[lVar30].lines;
          local_c8 = *pdVar24;
          uVar34 = (uint)(((plVar11->v1->p).X - vertexes[(int)uVar20].p.X) * (plVar11->delta).Y +
                          (vertexes[(int)uVar20].p.Y - (plVar11->v1->p).Y) * (plVar11->delta).X <=
                         1.52587890625e-05);
          auVar52._0_4_ = (int)(uVar34 << 0x1f) >> 0x1f;
          auVar52._4_4_ = (int)(uVar34 << 0x1f) >> 0x1f;
          auVar52._8_4_ = (int)(uVar34 << 0x1f) >> 0x1f;
          auVar52._12_4_ = (int)(uVar34 << 0x1f) >> 0x1f;
          auVar16._8_8_ = dStack_80;
          auVar16._0_8_ = local_88;
          auVar17._8_8_ = dStack_40;
          auVar17._0_8_ = local_48;
          auVar49 = auVar17 & auVar52 | ~auVar52 & auVar16;
          auVar59 = auVar16 & auVar52 | ~auVar52 & auVar17;
          auVar57._0_8_ = auVar45._8_8_;
          auVar57._8_4_ = auVar45._0_4_;
          auVar57._12_4_ = auVar45._4_4_;
          auVar48 = ~auVar52 & auVar57 | auVar45 & auVar52;
          uStack_c0 = 0;
          dVar43 = auVar48._0_8_ - local_c8;
          dVar54 = auVar48._8_8_ - local_c8;
          dStack_e0 = auVar44._8_8_;
          dVar42 = auVar49._0_8_ - auVar44._0_8_;
          dStack_70 = auVar49._8_8_ - dStack_e0;
          dVar51 = auVar59._0_8_ - auVar44._0_8_;
          dStack_e0 = auVar59._8_8_ - dStack_e0;
          local_68 = dVar43 * dVar51 - dVar54 * dVar42;
          dStack_60 = dVar54 * dStack_e0 - dVar43 * dStack_70;
          local_78 = dStack_70 * dVar42 - dStack_e0 * dVar51;
          dVar42 = c_sqrt(local_78 * local_78 + dStack_60 * dStack_60 + local_68 * local_68);
          pdVar29 = local_50;
          if ((dVar42 != 0.0) || (NAN(dVar42))) {
            dVar42 = 1.0 / dVar42;
            dVar54 = local_78 * dVar42;
            dVar43 = -dVar54;
            bVar33 = (bool)(bVar37 & dVar43 < dVar54 | dVar54 < dVar43 & bVar19);
            if (!bVar33) {
              dVar43 = dVar54;
            }
            psVar25 = &psVar10[lVar30].ceilingplane;
            if (bVar19) {
              psVar25 = &psVar10[lVar30].floorplane;
            }
            auVar50._0_8_ = dVar42 * local_68;
            auVar50._8_8_ = dVar42 * dStack_60;
            auVar53._0_4_ = (int)((uint)bVar33 << 0x1f) >> 0x1f;
            auVar53._4_4_ = (int)((uint)bVar33 << 0x1f) >> 0x1f;
            auVar53._8_4_ = (int)((uint)bVar33 << 0x1f) >> 0x1f;
            auVar53._12_4_ = (int)((uint)bVar33 << 0x1f) >> 0x1f;
            auVar49 = (auVar50 ^ _DAT_005d6f40) & auVar53 | ~auVar53 & auVar50;
            uVar18 = (ulong)DAT_005d6f40;
            dVar42 = vertexes[(int)uVar20].p.X;
            dVar54 = vertexes[(int)uVar20].p.Y;
            (psVar25->normal).X = (double)auVar49._0_8_;
            (psVar25->normal).Y = (double)auVar49._8_8_;
            (psVar25->normal).Z = dVar43;
            psVar25->D = ((double)(auVar49._0_8_ ^ uVar18) * dVar42 - auVar49._8_8_ * dVar54) -
                         local_c8 * dVar43;
            psVar25->negiC = -1.0 / dVar43;
          }
LAB_00451ce9:
          bVar37 = 1;
          pTVar26 = &local_a0;
          lVar40 = local_58;
          iVar21 = numsectors;
          bVar33 = false;
        } while (bVar19);
      }
      lVar30 = lVar40 + 1;
    } while (lVar30 < iVar21);
  }
  lVar30 = 0x18;
  do {
    TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::~TMap
              ((TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *)(local_b8 + lVar30));
    lVar30 = lVar30 + -0x18;
  } while (lVar30 != -0x18);
  return;
}

Assistant:

void P_SpawnSlopeMakers (FMapThing *firstmt, FMapThing *lastmt, const int *oldvertextable)
{
	FMapThing *mt;

	for (mt = firstmt; mt < lastmt; ++mt)
	{
		if (mt->info != NULL && mt->info->Type == NULL &&
		   (mt->info->Special >= SMT_SlopeFloorPointLine && mt->info->Special <= SMT_VavoomCeiling))
		{
			DVector3 pos = mt->pos;
			secplane_t *refplane;
			sector_t *sec;
			bool ceiling;

			sec = P_PointInSector (mt->pos);
			if (mt->info->Special == SMT_SlopeCeilingPointLine || mt->info->Special == SMT_VavoomCeiling || mt->info->Special == SMT_SetCeilingSlope)
			{
				refplane = &sec->ceilingplane;
				ceiling = true;
			}
			else
			{
				refplane = &sec->floorplane;
				ceiling = false;
			}
			pos.Z = refplane->ZatPoint (mt->pos) + mt->pos.Z;

			if (mt->info->Special <= SMT_SlopeCeilingPointLine)
			{ // SlopeFloorPointLine and SlopCeilingPointLine
				P_SlopeLineToPoint (mt->args[0], pos, ceiling);
			}
			else if (mt->info->Special <= SMT_SetCeilingSlope)
			{ // SetFloorSlope and SetCeilingSlope
				P_SetSlope (refplane, ceiling, mt->angle, mt->args[0], pos);
			}
			else 
			{ // VavoomFloor and VavoomCeiling (these do not perform any sector height adjustment - z is absolute)
				P_VavoomSlope(sec, mt->thingid, mt->pos, ceiling); 
			}
			mt->EdNum = 0;
		}
	}

	for (mt = firstmt; mt < lastmt; ++mt)
	{
		if (mt->info != NULL && mt->info->Type == NULL &&
			(mt->info->Special == SMT_CopyFloorPlane || mt->info->Special == SMT_CopyCeilingPlane))
		{
			P_CopyPlane (mt->args[0], mt->pos, mt->info->Special == SMT_CopyCeilingPlane);
			mt->EdNum = 0;
		}
	}

	P_SetSlopesFromVertexHeights(firstmt, lastmt, oldvertextable);
}